

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O2

void __thiscall InputGraph::InputGraph(InputGraph *this,int size,bool v,bool e)

{
  _Head_base<0UL,_InputGraph::Imp_*,_false> _Var1;
  _Base_ptr p_Var2;
  allocator_type local_31;
  
  _Var1._M_head_impl = (Imp *)operator_new(0x100);
  (_Var1._M_head_impl)->size = 0;
  (_Var1._M_head_impl)->has_vertex_labels = false;
  (_Var1._M_head_impl)->has_edge_labels = false;
  *(_Base_ptr *)((long)&(_Var1._M_head_impl)->edges + 0x10) = (_Base_ptr)0x0;
  p_Var2 = (_Base_ptr)((long)&(_Var1._M_head_impl)->edges + 8);
  *(undefined8 *)&((_Var1._M_head_impl)->edges)._M_t = 0;
  *(undefined8 *)&((_Rb_tree_header *)((long)&(_Var1._M_head_impl)->edges + 8))->_M_header = 0;
  *(_Base_ptr *)((long)&(_Var1._M_head_impl)->edges + 0x18) = p_Var2;
  *(_Base_ptr *)((long)&(_Var1._M_head_impl)->edges + 0x20) = p_Var2;
  *(undefined1 (*) [32])((long)&(_Var1._M_head_impl)->edges + 0x28) = ZEXT432(0) << 0x40;
  boost::bimaps::
  bimap<boost::bimaps::unordered_set_of<int,_boost::hash<int>,_std::equal_to<int>_>,_boost::bimaps::unordered_set_of<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::container::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_2U,_0U>,_mpl_::na,_mpl_::na>
  ::bimap(&(_Var1._M_head_impl)->vertex_names,&local_31);
  (this->_imp)._M_t.super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>.
  _M_t.super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
  super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl = _Var1._M_head_impl;
  (_Var1._M_head_impl)->has_vertex_labels = v;
  (_Var1._M_head_impl)->has_edge_labels = e;
  (_Var1._M_head_impl)->loopy = false;
  (_Var1._M_head_impl)->directed = false;
  if (size != 0) {
    resize(this,size);
  }
  return;
}

Assistant:

InputGraph::InputGraph(int size, bool v, bool e) :
    _imp(new Imp{})
{
    _imp->has_vertex_labels = v;
    _imp->has_edge_labels = e;
    _imp->loopy = false;
    _imp->directed = false;

    if (0 != size)
        resize(size);
}